

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O2

void __thiscall echo_server::echo_server(echo_server *this,epoll *ep,ipv4_endpoint *param_2)

{
  _Rb_tree_header *p_Var1;
  ipv4_endpoint iVar2;
  on_connected_t local_60;
  _Bind<void_(echo_server::*(echo_server_*))()> local_40;
  
  this->ep = ep;
  iVar2 = *param_2;
  local_40._M_f = (offset_in_echo_server_to_subr)on_new_connection;
  local_40._8_8_ = 0;
  local_40._M_bound_args.super__Tuple_impl<0UL,_echo_server_*>.
  super__Head_base<0UL,_echo_server_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_echo_server_*>)(_Tuple_impl<0UL,_echo_server_*>)this;
  std::function<void()>::function<std::_Bind<void(echo_server::*(echo_server*))()>,void>
            ((function<void()> *)&local_60,&local_40);
  server_socket::server_socket(&this->ss,ep,iVar2,&local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

echo_server::echo_server(epoll &ep, ipv4_endpoint const& local_endpoint)
    : ep(ep)
    , ss{ep, local_endpoint, std::bind(&echo_server::on_new_connection, this)}
{}